

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.h
# Opt level: O0

uint32_t anon_unknown.dwarf_2ce2b::fmp4_endian_swap32(uint32_t in)

{
  uint32_t in_local;
  
  return in << 0x18 | (in & 0xff00) << 8 | (in & 0xff0000) >> 8 | in >> 0x18;
}

Assistant:

uint32_t fmp4_endian_swap32(uint32_t in) {
		return  ((in & 0x000000FF) << 24) | \
			((in & 0x0000FF00) << 8) | \
			((in & 0x00FF0000) >> 8) | \
			((in & 0xFF000000) >> 24);
	}